

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O2

void __thiscall KktCheck::checkKKT(KktCheck *this)

{
  char *pcVar1;
  ofstream myfile;
  
  if (this->numCol != 0) {
    this->istrueGlb = false;
    makeARCopy(this);
    chPrimalBounds(this);
    chPrimalFeas(this);
    chDualFeas(this);
    chComplementarySlackness(this);
    chStOfLagrangian(this);
    if (this->print == 2) {
      std::ofstream::ofstream(&myfile);
      std::ofstream::open((char *)&myfile,0x157b07);
      pcVar1 = "           KKT pass      ";
      if (this->istrueGlb != false) {
        pcVar1 = "           KKT fail      ";
      }
      std::operator<<((ostream *)&myfile,pcVar1);
      std::ofstream::close();
      std::ofstream::~ofstream(&myfile);
    }
  }
  return;
}

Assistant:

void KktCheck::checkKKT() {
	if (numCol == 0)
		return;
	
	istrueGlb = false;
	

	makeARCopy();
	//printAR();printSol();
	chPrimalBounds() ;
	chPrimalFeas();
	chDualFeas();
	chComplementarySlackness();
	chStOfLagrangian();
	
	if (print == 2) {
		ofstream myfile;
  		myfile.open ("../experiments/out", ios::app ); 
		if (istrueGlb)	
			myfile << "           KKT fail      ";
		else
			myfile << "           KKT pass      ";
  		myfile.close();
	}
		
}